

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O3

void plot_getrect(t_gobj *z,_glist *glist,t_word *data,t_template *template,t_float basex,
                 t_float basey,int *xp1,int *yp1,int *xp2,int *yp2)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  _parentwidgetbehavior *p_Var4;
  t_gobj *x;
  long lVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  t_float tVar13;
  t_float local_154;
  int yy2;
  int yy1;
  int xx2;
  int xx1;
  t_float wpix;
  t_float ypix;
  t_float xpix;
  t_float scalarvis;
  t_float vis;
  t_float yloc;
  t_float xinc;
  t_float xloc;
  int xonset;
  int wonset;
  int yonset;
  int elemsize;
  double local_f0;
  _fielddesc *local_e8;
  ulong local_e0;
  _fielddesc *local_d8;
  _glist *local_d0;
  double local_c8;
  double local_c0;
  int *local_b8;
  int *local_b0;
  _glist *local_a8;
  long local_a0;
  ulong local_98;
  _fielddesc *local_90;
  long local_88;
  t_template *local_80;
  _fielddesc *wfielddesc;
  _fielddesc *yfielddesc;
  _fielddesc *xfielddesc;
  _array *array;
  t_symbol *elemtemplatesym;
  t_template *elemtemplate;
  _glist *elemtemplatecanvas;
  t_float edit;
  t_float style;
  t_float linewidth;
  
  if ((glist->gl_list == (t_gobj *)0x0) || (glist->gl_list->g_next != (_gobj *)0x0)) {
    local_d0 = glist;
    local_b8 = xp1;
    local_b0 = yp1;
    iVar3 = plot_readownertemplate
                      ((t_plot *)z,data,template,&elemtemplatesym,&array,&linewidth,&xloc,&xinc,
                       &yloc,&style,&vis,&scalarvis,&edit,&xfielddesc,&yfielddesc,&wfielddesc);
    iVar8 = -0x7fffffff;
    iVar10 = 0x7fffffff;
    if ((iVar3 == 0) &&
       (((vis != 0.0 || (NAN(vis))) &&
        (iVar3 = array_getfields(elemtemplatesym,&elemtemplatecanvas,&elemtemplate,&elemsize,
                                 xfielddesc,yfielddesc,wfielddesc,&xonset,&yonset,&wonset),
        iVar3 == 0)))) {
      local_90 = wfielddesc;
      local_d8 = yfielddesc;
      local_e8 = xfielddesc;
      uVar1 = array->a_n;
      iVar6 = -0x7fffffff;
      iVar3 = 0x7fffffff;
      if (0 < (int)uVar1) {
        local_98 = 1;
        if (2000 < uVar1) {
          local_98 = (ulong)uVar1 / 1000;
        }
        local_a0 = (long)elemsize;
        local_e0 = (ulong)(uint)yonset;
        local_c0 = (double)basex;
        local_c8 = (double)xinc;
        local_a8 = elemtemplatecanvas;
        local_80 = elemtemplate;
        local_f0 = 0.0;
        local_88 = 0;
        iVar8 = -0x7fffffff;
        iVar10 = 0x7fffffff;
        iVar3 = 0x7fffffff;
        iVar6 = -0x7fffffff;
        do {
          lVar5 = local_88 * local_a0;
          array_getcoordinate(local_d0,array->a_vec + lVar5,xonset,(int)local_e0,wonset,
                              (int)local_88,basex + xloc,basey + yloc,xinc,local_e8,local_d8,
                              local_90,&xpix,&ypix,&wpix);
          if (xpix < (float)iVar3) {
            iVar3 = (int)xpix;
          }
          if ((float)iVar8 < xpix) {
            iVar8 = (int)xpix;
          }
          iVar12 = (int)(ypix - wpix);
          if ((float)iVar10 <= ypix - wpix) {
            iVar12 = iVar10;
          }
          iVar10 = iVar12;
          iVar12 = (int)(ypix + wpix);
          if (ypix + wpix <= (float)iVar6) {
            iVar12 = iVar6;
          }
          iVar6 = iVar12;
          if ((scalarvis != 0.0) || (NAN(scalarvis))) {
            if (xonset < 0) {
              local_154 = (t_float)(local_f0 + local_c0);
              local_f0 = local_f0 + local_c8;
            }
            else {
              tVar13 = fielddesc_cvttocoord
                                 (local_e8,*(t_float *)(array->a_vec + (ulong)(uint)xonset + lVar5))
              ;
              local_154 = tVar13 + basex + xloc;
            }
            if ((int)local_e0 < 0) {
              tVar13 = 0.0;
            }
            else {
              tVar13 = *(t_float *)(array->a_vec + local_e0 + lVar5);
            }
            tVar13 = fielddesc_cvttocoord(local_d8,tVar13);
            x = local_a8->gl_list;
            if (x != (t_gobj *)0x0) {
              iVar12 = iVar3;
              iVar9 = iVar8;
              iVar11 = iVar10;
              iVar7 = iVar6;
              do {
                p_Var4 = pd_getparentwidget(&x->g_pd);
                if (p_Var4 != (_parentwidgetbehavior *)0x0) {
                  (*p_Var4->w_parentgetrectfn)
                            (x,local_d0,(t_word *)(array->a_vec + lVar5),local_80,local_154,
                             tVar13 + basey + yloc,&xx1,&yy1,&xx2,&yy2);
                  bVar2 = xx1 < iVar3;
                  iVar3 = iVar12;
                  if (bVar2) {
                    iVar3 = xx1;
                  }
                  bVar2 = yy1 < iVar10;
                  iVar10 = iVar11;
                  if (bVar2) {
                    iVar10 = yy1;
                  }
                  bVar2 = iVar8 < xx2;
                  iVar8 = iVar9;
                  if (bVar2) {
                    iVar8 = xx2;
                  }
                  bVar2 = iVar6 < yy2;
                  iVar6 = iVar7;
                  iVar12 = iVar3;
                  iVar9 = iVar8;
                  iVar11 = iVar10;
                  if (bVar2) {
                    iVar6 = yy2;
                    iVar7 = yy2;
                  }
                }
                x = x->g_next;
              } while (x != (_gobj *)0x0);
            }
          }
          local_88 = local_88 + local_98;
        } while (local_88 < array->a_n);
      }
    }
    else {
      iVar6 = -0x7fffffff;
      iVar3 = 0x7fffffff;
    }
    *local_b8 = iVar3;
    *local_b0 = iVar10;
    *xp2 = iVar8;
    *yp2 = iVar6;
  }
  else {
    *yp1 = -0x7fffffff;
    *xp1 = -0x7fffffff;
    *yp2 = 0x7fffffff;
    *xp2 = 0x7fffffff;
  }
  return;
}

Assistant:

static void plot_getrect(t_gobj *z, t_glist *glist,
    t_word *data, t_template *template, t_float basex, t_float basey,
    int *xp1, int *yp1, int *xp2, int *yp2)
{
    t_plot *x = (t_plot *)z;
    int elemsize, yonset, wonset, xonset;
    t_canvas *elemtemplatecanvas;
    t_template *elemtemplate;
    t_symbol *elemtemplatesym;
    t_float linewidth, xloc, xinc, yloc, style, yval, vis, scalarvis, edit;
    double xsum;
    t_array *array;
    int x1 = 0x7fffffff, y1 = 0x7fffffff, x2 = -0x7fffffff, y2 = -0x7fffffff;
    int i;
    t_float xpix, ypix, wpix;
    t_fielddesc *xfielddesc, *yfielddesc, *wfielddesc;
        /* if we're the only plot in the glist claim the whole thing */
    if (glist->gl_list && !glist->gl_list->g_next)
    {
        *xp1 = *yp1 = -0x7fffffff;
        *xp2 = *yp2 = 0x7fffffff;
        return;
    }
    if (!plot_readownertemplate(x, data, template,
        &elemtemplatesym, &array, &linewidth, &xloc, &xinc, &yloc, &style,
            &vis, &scalarvis, &edit, &xfielddesc, &yfielddesc, &wfielddesc) &&
                (vis != 0) &&
            !array_getfields(elemtemplatesym, &elemtemplatecanvas,
                &elemtemplate, &elemsize,
                xfielddesc, yfielddesc, wfielddesc,
                &xonset, &yonset, &wonset))
    {
            /* if it has more than 2000 points, just check 1000 of them. */
        int incr = (array->a_n <= 2000 ? 1 : array->a_n / 1000);
        for (i = 0, xsum = 0; i < array->a_n; i += incr)
        {
            t_float usexloc, useyloc;
            t_gobj *y;
                /* get the coords of the point proper */
            array_getcoordinate(glist, (char *)(array->a_vec) + i * elemsize,
                xonset, yonset, wonset, i, basex + xloc, basey + yloc, xinc,
                xfielddesc, yfielddesc, wfielddesc, &xpix, &ypix, &wpix);
            if (xpix < x1)
                x1 = xpix;
            if (xpix > x2)
                x2 = xpix;
            if (ypix - wpix < y1)
                y1 = ypix - wpix;
            if (ypix + wpix > y2)
                y2 = ypix + wpix;

            if (scalarvis != 0)
            {
                    /* check also the drawing instructions for the scalar */
                if (xonset >= 0)
                    usexloc = basex + xloc + fielddesc_cvttocoord(xfielddesc,
                        *(t_float *)(((char *)(array->a_vec) + elemsize * i)
                            + xonset));
                else usexloc = basex + xsum, xsum += xinc;
                if (yonset >= 0)
                    yval = *(t_float *)(((char *)(array->a_vec) + elemsize * i)
                        + yonset);
                else yval = 0;
                useyloc = basey + yloc + fielddesc_cvttocoord(yfielddesc, yval);
                for (y = elemtemplatecanvas->gl_list; y; y = y->g_next)
                {
                    int xx1, xx2, yy1, yy2;
                    const t_parentwidgetbehavior *wb =
                        pd_getparentwidget(&y->g_pd);
                    if (!wb) continue;
                    (*wb->w_parentgetrectfn)(y, glist,
                        (t_word *)((char *)(array->a_vec) + elemsize * i),
                            elemtemplate, usexloc, useyloc,
                                &xx1, &yy1, &xx2, &yy2);
                    if (xx1 < x1)
                        x1 = xx1;
                    if (yy1 < y1)
                        y1 = yy1;
                     if (xx2 > x2)
                        x2 = xx2;
                    if (yy2 > y2)
                        y2 = yy2;
                }
            }
        }
    }

    *xp1 = x1;
    *yp1 = y1;
    *xp2 = x2;
    *yp2 = y2;
}